

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagBuilder.cpp
# Opt level: O0

DiagBuilder * __thiscall Mond::DiagBuilder::operator<<(DiagBuilder *this,DiagSentinel b)

{
  Diag local_b0;
  allocator local_59;
  string local_58 [32];
  string local_38 [36];
  DiagSentinel local_14;
  DiagBuilder *pDStack_10;
  DiagSentinel b_local;
  DiagBuilder *this_local;
  
  local_14 = b;
  pDStack_10 = this;
  WriteRest(this);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&(this->m_diag).message,local_38);
  std::__cxx11::string::~string(local_38);
  std::function<void_(const_Mond::Diag_&)>::operator()(&this->m_func,&this->m_diag);
  this->m_pos = 0;
  this->m_fmt = (char *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"",&local_59);
  std::__cxx11::stringstream::str((string *)&this->m_msg);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  memset(&local_b0,0,0x40);
  Diag::Diag(&local_b0);
  Diag::operator=(&this->m_diag,&local_b0);
  Diag::~Diag(&local_b0);
  return this;
}

Assistant:

DiagBuilder &DiagBuilder::operator<<(DiagSentinel b)
{
	WriteRest();

	m_diag.message = m_msg.str();
	m_func(m_diag);

	m_pos = 0;
	m_fmt = NULL;
	m_msg.str("");
	m_diag = Diag();

	return *this;
}